

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void init_client_web(int port,char *address)

{
  int iVar1;
  char *__s;
  sockaddr_in web_addr;
  
  sock = socket(2,1,0);
  if (sock == -1) {
    __s = "Socket";
  }
  else {
    web_addr.sin_family = 2;
    web_addr.sin_port = (ushort)port << 8 | (ushort)port >> 8;
    iVar1 = inet_aton(address,(in_addr *)&web_addr.sin_addr);
    if (iVar1 == 0) {
      __s = "inet_aton";
    }
    else {
      iVar1 = connect(sock,(sockaddr *)&web_addr,0x10);
      if (iVar1 != -1) {
        return;
      }
      __s = "connect";
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

void init_client_web(int port, char*address){
    sock = socket(AF_INET,SOCK_STREAM,0);
    if(sock == -1){
        perror("Socket");
        exit(EXIT_FAILURE);
    }
    struct sockaddr_in web_addr;
    web_addr.sin_family = AF_INET;
    web_addr.sin_port = htons((uint16_t) port);

    if (inet_aton(address, &web_addr.sin_addr) == 0) {
        perror("inet_aton");
        exit(EXIT_FAILURE);
    }

    if(connect(sock,(struct sockaddr *)&web_addr,sizeof(web_addr)) == -1){
        perror("connect");
        exit(EXIT_FAILURE);
    }
}